

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_impl.cpp
# Opt level: O0

MPP_RET enc_impl_gen_hdr(EncImpl impl,MppPacket pkt)

{
  EncImplCtx *p;
  MPP_RET ret;
  MppPacket pkt_local;
  EncImpl impl_local;
  
  if (impl == (EncImpl)0x0) {
    _mpp_log_l(2,"enc_impl","found NULL input\n","enc_impl_gen_hdr");
    impl_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    p._4_4_ = MPP_OK;
    if (*(long *)(*(long *)((long)impl + 0x18) + 0x30) != 0) {
      if (pkt != (MppPacket)0x0) {
        mpp_packet_reset_segment(pkt);
      }
      p._4_4_ = (**(code **)(*(long *)((long)impl + 0x18) + 0x30))
                          (*(undefined8 *)((long)impl + 0x20),pkt);
    }
    impl_local._4_4_ = p._4_4_;
  }
  return impl_local._4_4_;
}

Assistant:

MPP_RET enc_impl_gen_hdr(EncImpl impl, MppPacket pkt)
{
    if (NULL == impl) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MPP_RET ret = MPP_OK;
    EncImplCtx *p = (EncImplCtx *)impl;

    if (p->api->gen_hdr) {
        if (pkt)
            mpp_packet_reset_segment(pkt);

        ret = p->api->gen_hdr(p->ctx, pkt);
    }

    return ret;
}